

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::raft_server(raft_server *this,context *ctx)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  log_val_type lVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar7;
  element_type *peVar8;
  undefined4 extraout_var_01;
  unsigned_long *puVar9;
  undefined4 extraout_var_02;
  element_type *this_00;
  element_type *peVar10;
  element_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  element_type *peVar11;
  undefined8 *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_shared_ptr<peer>_>_&&>::value,_pair<iterator,_bool>_>
  _Var12;
  thread commiting_thread;
  executor exec;
  lock_guard<std::shared_timed_mutex> wlock;
  srv_itor it;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *srvs;
  ptr<log_entry> entry;
  ulong i;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  random_device rd;
  pointer in_stack_ffffffffffffe8e8;
  context *in_stack_ffffffffffffe8f0;
  pair<int,_std::shared_ptr<cornerstone::peer>_> *in_stack_ffffffffffffe8f8;
  undefined7 in_stack_ffffffffffffe900;
  undefined1 in_stack_ffffffffffffe907;
  anon_class_16_2_1b063617 *in_stack_ffffffffffffe908;
  raft_server *in_stack_ffffffffffffe910;
  type in_stack_ffffffffffffe918;
  allocator<char> *in_stack_ffffffffffffe920;
  int32 in_stack_ffffffffffffe928;
  int32 in_stack_ffffffffffffe92c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe930;
  allocator<char> local_1591;
  strfmt<30> local_1590;
  string local_1568 [48];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_1538;
  undefined1 local_1530;
  int32 local_1514;
  _Self local_14c8;
  _Self local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_14b8;
  int local_14b0;
  allocator<char> local_14a9;
  strfmt<100> local_14a8;
  string local_1438 [32];
  undefined1 local_1418 [16];
  unsigned_long local_1408;
  unsigned_long local_1400;
  ulong local_13f8;
  undefined8 local_13e0;
  undefined8 local_13d8;
  undefined8 local_13d0;
  undefined8 local_13c8;
  
  *in_RDI = &PTR__raft_server_002499d8;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  peVar5 = std::
           __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b7aa5);
  iVar3 = (*peVar5->_vptr_state_mgr[7])();
  *(int *)((long)in_RDI + 0xc) = iVar3;
  *(undefined4 *)(in_RDI + 2) = 0;
  peVar6 = std::
           __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b7ad6);
  iVar3 = (*peVar6->_vptr_state_machine[9])();
  in_RDI[3] = CONCAT44(extraout_var,iVar3);
  peVar6 = std::
           __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b7b02);
  iVar3 = (*peVar6->_vptr_state_machine[9])();
  in_RDI[4] = CONCAT44(extraout_var_00,iVar3);
  *(undefined1 *)(in_RDI + 5) = 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  std::unique_ptr<cornerstone::context,std::default_delete<cornerstone::context>>::
  unique_ptr<std::default_delete<cornerstone::context>,void>
            ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
             in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8);
  std::shared_ptr<cornerstone::delayed_task_scheduler>::shared_ptr
            ((shared_ptr<cornerstone::delayed_task_scheduler> *)in_stack_ffffffffffffe8f0,
             (shared_ptr<cornerstone::delayed_task_scheduler> *)in_stack_ffffffffffffe8e8);
  std::function<void()>::
  function<cornerstone::raft_server::raft_server(cornerstone::context*)::__0,void>
            ((function<void_()> *)CONCAT17(in_stack_ffffffffffffe907,in_stack_ffffffffffffe900),
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe8f8);
  std::shared_ptr<cornerstone::delayed_task>::shared_ptr
            ((shared_ptr<cornerstone::delayed_task> *)0x1b7bb8);
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x16] = 0;
  std::
  unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
  ::unordered_map((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                   *)0x1b7bff);
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x1d] = 0;
  std::shared_timed_mutex::shared_timed_mutex((shared_timed_mutex *)0x1b7c3e);
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x24] = 0;
  std::
  unordered_map<int,_std::shared_ptr<cornerstone::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::rpc_client>_>_>_>
  ::unordered_map((unordered_map<int,_std::shared_ptr<cornerstone::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::rpc_client>_>_>_>
                   *)0x1b7c85);
  *(undefined4 *)(in_RDI + 0x25) = 1;
  peVar5 = std::
           __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b7cb2);
  (*peVar5->_vptr_state_mgr[5])(in_RDI + 0x26);
  peVar5 = std::
           __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b7ceb);
  (*peVar5->_vptr_state_mgr[6])(in_RDI + 0x28);
  std::shared_ptr<cornerstone::state_machine>::shared_ptr
            ((shared_ptr<cornerstone::state_machine> *)in_stack_ffffffffffffe8f0,
             (shared_ptr<cornerstone::state_machine> *)in_stack_ffffffffffffe8e8);
  std::shared_ptr<cornerstone::logger>::shared_ptr
            ((shared_ptr<cornerstone::logger> *)in_stack_ffffffffffffe8f0,
             (shared_ptr<cornerstone::logger> *)in_stack_ffffffffffffe8e8);
  std::function<int_()>::function((function<int_()> *)in_stack_ffffffffffffe8f0);
  peVar5 = std::
           __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b7d90);
  (*peVar5->_vptr_state_mgr[2])(in_RDI + 0x32);
  std::shared_ptr<cornerstone::peer>::shared_ptr((shared_ptr<cornerstone::peer> *)0x1b7dc2);
  std::shared_ptr<cornerstone::srv_config>::shared_ptr
            ((shared_ptr<cornerstone::srv_config> *)0x1b7dde);
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  in_RDI[0x3c] = 0;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x1b7e19);
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x41] = 0;
  std::mutex::mutex((mutex *)0x1b7e51);
  in_RDI[0x44] = 0;
  in_RDI[0x45] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  in_RDI[0x46] = 0;
  std::mutex::mutex((mutex *)0x1b7e89);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x47));
  in_RDI[0x4f] = 0;
  in_RDI[0x50] = 0;
  in_RDI[0x4d] = 0;
  in_RDI[0x4e] = 0;
  in_RDI[0x51] = 0;
  std::mutex::mutex((mutex *)0x1b7edd);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x52));
  std::
  function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>
  ::function<cornerstone::raft_server::raft_server(cornerstone::context*)::__1,void>
            ((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
              *)CONCAT17(in_stack_ffffffffffffe907,in_stack_ffffffffffffe900),
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe8f8);
  std::
  function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>
  ::function<cornerstone::raft_server::raft_server(cornerstone::context*)::__2,void>
            ((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
              *)CONCAT17(in_stack_ffffffffffffe907,in_stack_ffffffffffffe900),
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe8f8);
  peVar6 = std::
           __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b7f7e);
  (*peVar6->_vptr_state_machine[8])(in_RDI + 0x60);
  in_RDI[0x66] = 0;
  in_RDI[0x67] = 0;
  in_RDI[100] = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x62] = 0;
  in_RDI[99] = 0;
  in_RDI[0x68] = 0;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x1b7fd6);
  std::unique_ptr<cornerstone::prevote_state,std::default_delete<cornerstone::prevote_state>>::
  unique_ptr<std::default_delete<cornerstone::prevote_state>,void>
            ((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
              *)in_stack_ffffffffffffe8f0);
  std::random_device::random_device((random_device *)in_stack_ffffffffffffe930);
  std::random_device::operator()((random_device *)0x1b800e);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffe8f0,(result_type_conflict)in_stack_ffffffffffffe8e8);
  std::unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>::
  operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_> *
             )0x1b8042);
  std::unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>::
  operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_> *
             )0x1b805d);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffe8f0,
             (int)((ulong)in_stack_ffffffffffffe8e8 >> 0x20),(int)in_stack_ffffffffffffe8e8);
  local_13e0 = local_13d0;
  local_13d8 = local_13c8;
  std::function<int()>::operator=
            ((function<int_()> *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x26));
  if (!bVar2) {
    cs_new<cornerstone::srv_state>();
    std::shared_ptr<cornerstone::srv_state>::operator=
              ((shared_ptr<cornerstone::srv_state> *)in_stack_ffffffffffffe8f0,
               (shared_ptr<cornerstone::srv_state> *)in_stack_ffffffffffffe8e8);
    std::shared_ptr<cornerstone::srv_state>::~shared_ptr
              ((shared_ptr<cornerstone::srv_state> *)0x1b8115);
    peVar7 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8122);
    srv_state::set_term(peVar7,0);
    peVar7 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8144);
    srv_state::set_voted_for(peVar7,-1);
  }
  local_1400 = in_RDI[4] + 1;
  peVar8 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b8211);
  iVar3 = (*peVar8->_vptr_log_store[3])();
  local_1408 = CONCAT44(extraout_var_01,iVar3);
  puVar9 = std::max<unsigned_long>(&local_1400,&local_1408);
  local_13f8 = *puVar9;
  while( true ) {
    uVar1 = local_13f8;
    peVar8 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b828a);
    iVar3 = (*peVar8->_vptr_log_store[2])();
    if (CONCAT44(extraout_var_02,iVar3) <= uVar1) break;
    peVar8 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b82c4);
    (*peVar8->_vptr_log_store[8])(local_1418,peVar8,local_13f8);
    this_00 = std::
              __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b82ef);
    lVar4 = log_entry::get_val_type(this_00);
    if (lVar4 == conf) {
      peVar10 = std::
                __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b831e);
      strfmt<100>::strfmt(&local_14a8,
                          "detect a configuration change that is not committed yet at index %llu");
      strfmt<100>::fmt<unsigned_long>
                ((strfmt<100> *)in_stack_ffffffffffffe8f0,(unsigned_long)in_stack_ffffffffffffe8e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe930,
                 (char *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928),
                 in_stack_ffffffffffffe920);
      (*peVar10->_vptr_logger[3])(peVar10,local_1438);
      std::__cxx11::string::~string(local_1438);
      std::allocator<char>::~allocator(&local_14a9);
      *(undefined1 *)((long)in_RDI + 0x29) = 1;
      local_14b0 = 2;
    }
    else {
      local_14b0 = 0;
    }
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x1b8442);
    if (local_14b0 != 0) break;
    local_13f8 = local_13f8 + 1;
  }
  this_01 = std::
            __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b8492);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cluster_config::get_servers_abi_cxx11_(this_01);
  local_14b8 = this_02;
  local_14c0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
       ::begin((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                *)in_stack_ffffffffffffe8e8);
  while( true ) {
    local_14c8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
         ::end((list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                *)in_stack_ffffffffffffe8e8);
    bVar2 = std::operator!=(&local_14c0,&local_14c8);
    if (!bVar2) break;
    std::_List_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
              ((_List_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
               in_stack_ffffffffffffe8f0);
    peVar11 = std::
              __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b850b);
    in_stack_ffffffffffffe92c = srv_config::get_id(peVar11);
    if (in_stack_ffffffffffffe92c != *(int *)((long)in_RDI + 0xc)) {
      std::lock_guard<std::shared_timed_mutex>::lock_guard
                ((lock_guard<std::shared_timed_mutex> *)in_stack_ffffffffffffe8f0,
                 (mutex_type *)in_stack_ffffffffffffe8e8);
      std::function<void(cornerstone::peer&)>::
      function<cornerstone::raft_server::raft_server(cornerstone::context*)::__4,void>
                ((function<void_(cornerstone::peer_&)> *)
                 CONCAT17(in_stack_ffffffffffffe907,in_stack_ffffffffffffe900),
                 (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe8f8);
      in_stack_ffffffffffffe920 = (allocator<char> *)(in_RDI + 0x10);
      std::_List_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
                ((_List_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
                 in_stack_ffffffffffffe8f0);
      peVar11 = std::
                __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b8597);
      in_stack_ffffffffffffe928 = srv_config::get_id(peVar11);
      local_1514 = in_stack_ffffffffffffe928;
      in_stack_ffffffffffffe910 =
           (raft_server *)
           std::_List_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
                     ((_List_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
                      in_stack_ffffffffffffe8f0);
      in_stack_ffffffffffffe918 =
           std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
           operator*((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *
                     )in_stack_ffffffffffffe8f0);
      cs_new<cornerstone::peer,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                ((shared_ptr<cornerstone::srv_config> *)in_stack_ffffffffffffe8f8,
                 in_stack_ffffffffffffe8f0,
                 (function<void_(cornerstone::peer_&)> *)in_stack_ffffffffffffe8e8);
      std::make_pair<int,std::shared_ptr<cornerstone::peer>>
                (&in_stack_ffffffffffffe8f8->first,
                 (shared_ptr<cornerstone::peer> *)in_stack_ffffffffffffe8f0);
      _Var12 = std::
               unordered_map<int,std::shared_ptr<cornerstone::peer>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::shared_ptr<cornerstone::peer>>>>
               ::insert<std::pair<int,std::shared_ptr<cornerstone::peer>>>
                         ((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffe907,in_stack_ffffffffffffe900),
                          in_stack_ffffffffffffe8f8);
      local_1538._M_cur =
           (__node_type *)
           _Var12.first.
           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
           ._M_cur;
      in_stack_ffffffffffffe907 = _Var12.second;
      local_1530 = in_stack_ffffffffffffe907;
      std::pair<int,_std::shared_ptr<cornerstone::peer>_>::~pair
                ((pair<int,_std::shared_ptr<cornerstone::peer>_> *)0x1b865c);
      std::shared_ptr<cornerstone::peer>::~shared_ptr((shared_ptr<cornerstone::peer> *)0x1b8669);
      std::function<void_(cornerstone::peer_&)>::~function
                ((function<void_(cornerstone::peer_&)> *)0x1b8676);
      std::lock_guard<std::shared_timed_mutex>::~lock_guard
                ((lock_guard<std::shared_timed_mutex> *)0x1b8683);
    }
    std::_List_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator++(&local_14c0);
  }
  std::thread::thread<cornerstone::raft_server::raft_server(cornerstone::context*)::__5,,void>
            ((thread *)in_stack_ffffffffffffe920,(type *)in_stack_ffffffffffffe918);
  iVar3 = (int)((ulong)in_stack_ffffffffffffe8e8 >> 0x20);
  std::thread::detach();
  restart_election_timer(in_stack_ffffffffffffe910);
  peVar10 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b876b);
  strfmt<30>::strfmt(&local_1590,"server %d started");
  strfmt<30>::fmt<int>((strfmt<30> *)in_stack_ffffffffffffe8f0,iVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)CONCAT44(in_stack_ffffffffffffe92c,in_stack_ffffffffffffe928),
             in_stack_ffffffffffffe920);
  (*peVar10->_vptr_logger[2])(peVar10,local_1568);
  std::__cxx11::string::~string(local_1568);
  std::allocator<char>::~allocator(&local_1591);
  std::thread::~thread((thread *)0x1b880d);
  std::random_device::~random_device((random_device *)0x1b881a);
  return;
}

Assistant:

raft_server::raft_server(context* ctx)
    : leader_(-1),
      id_(ctx->state_mgr_->server_id()),
      votes_granted_(0),
      quick_commit_idx_(ctx->state_machine_->last_commit_index()),
      sm_commit_index_(ctx->state_machine_->last_commit_index()),
      election_completed_(true),
      config_changing_(false),
      catching_up_(false),
      stopping_(false),
      steps_to_down_(0),
      snp_in_progress_(),
      ctx_(ctx),
      scheduler_(ctx->scheduler_),
      election_exec_([this]() { this->handle_election_timeout(); }),
      election_task_(),
      peers_(),
      peers_lock_(),
      rpc_clients_(),
      role_(srv_role::follower),
      state_(ctx->state_mgr_->read_state()),
      log_store_(ctx->state_mgr_->load_log_store()),
      state_machine_(ctx->state_machine_),
      l_(ctx->logger_),
      config_(ctx->state_mgr_->load_config()),
      srv_to_join_(),
      conf_to_add_(),
      lock_(),
      commit_lock_(),
      rpc_clients_lock_(),
      commit_cv_(),
      stopping_lock_(),
      ready_to_stop_cv_(),
      resp_handler_([this](ptr<resp_msg>& resp, const ptr<rpc_exception>& e) { this->handle_peer_resp(resp, e); }),
      ex_resp_handler_([this](ptr<resp_msg>& resp, const ptr<rpc_exception>& e) { this->handle_ext_resp(resp, e); }),
      last_snapshot_(ctx->state_machine_->last_snapshot()),
      voted_servers_(),
      prevote_state_()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(
        ctx->params_->election_timeout_lower_bound_, ctx->params_->election_timeout_upper_bound_);
    rand_timeout_ = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    if (!state_)
    {
        state_ = cs_new<srv_state>();
        state_->set_term(0);
        state_->set_voted_for(-1);
    }

    /**
     * I found this implementation is also a victim of bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
     * As the implementation is based on Diego's thesis
     * Fix:
     * We should never load configurations that is not committed,
     *   this prevents an old server from replicating an obsoleted config to other servers
     * The prove is as below:
     * Assume S0 is the last committed server set for the old server A
     * |- EXITS Log l which has been committed but l !BELONGS TO A.logs =>  Vote(A) < Majority(S0)
     * In other words, we need to prove that A cannot be elected to leader if any logs/configs has been committed.
     * Case #1, There is no configuration change since S0, then it's obvious that Vote(A) < Majority(S0), see the core
     * Algorithm Case #2, There are one or more configuration changes since S0, then at the time of first configuration
     * change was committed, there are at least Majority(S0 - 1) servers committed the configuration change Majority(S0
     * - 1) + Majority(S0) > S0 => Vote(A) < Majority(S0)
     * -|
     */
    for (ulong i = std::max(sm_commit_index_ + 1, log_store_->start_index()); i < log_store_->next_slot(); ++i)
    {
        ptr<log_entry> entry(log_store_->entry_at(i));
        if (entry->get_val_type() == log_val_type::conf)
        {
            l_->info(sstrfmt("detect a configuration change that is not committed yet at index %llu").fmt(i));
            config_changing_ = true;
            break;
        }
    }

    std::list<ptr<srv_config>>& srvs(config_->get_servers());
    for (cluster_config::srv_itor it = srvs.begin(); it != srvs.end(); ++it)
    {
        if ((*it)->get_id() != id_)
        {
            write_lock(peers_lock_);
            timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
            peers_.insert(std::make_pair(
                (*it)->get_id(),
                cs_new<peer>(*it, *ctx_, exec)));
        }
    }

    std::thread commiting_thread = std::thread([this]() { this->commit_in_bg(); });
    commiting_thread.detach();
    restart_election_timer();
    l_->debug(strfmt<30>("server %d started").fmt(id_));
}